

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pragmaFunclistLine(Vdbe *v,FuncDef *p,int isBuiltin,int showInternFuncs)

{
  char *local_30;
  char *zType;
  u32 mask;
  int showInternFuncs_local;
  int isBuiltin_local;
  FuncDef *p_local;
  Vdbe *v_local;
  
  zType._4_4_ = 0x3c0800;
  _showInternFuncs_local = p;
  if (showInternFuncs != 0) {
    zType._4_4_ = 0xffffffff;
  }
  for (; _showInternFuncs_local != (FuncDef *)0x0;
      _showInternFuncs_local = _showInternFuncs_local->pNext) {
    if ((_showInternFuncs_local->xSFunc !=
         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) &&
       (((_showInternFuncs_local->funcFlags & 0x40000) == 0 || (showInternFuncs != 0)))) {
      if (_showInternFuncs_local->xValue == (_func_void_sqlite3_context_ptr *)0x0) {
        if (_showInternFuncs_local->xFinalize == (_func_void_sqlite3_context_ptr *)0x0) {
          local_30 = "s";
        }
        else {
          local_30 = "a";
        }
      }
      else {
        local_30 = "w";
      }
      sqlite3VdbeMultiLoad
                (v,1,"sissii",_showInternFuncs_local->zName,(ulong)(uint)isBuiltin,local_30,
                 pragmaFunclistLine::azEnc[_showInternFuncs_local->funcFlags & 3],
                 (int)_showInternFuncs_local->nArg,
                 _showInternFuncs_local->funcFlags & zType._4_4_ ^ 0x200000);
    }
  }
  return;
}

Assistant:

static void pragmaFunclistLine(
  Vdbe *v,               /* The prepared statement being created */
  FuncDef *p,            /* A particular function definition */
  int isBuiltin,         /* True if this is a built-in function */
  int showInternFuncs    /* True if showing internal functions */
){
  u32 mask =
      SQLITE_DETERMINISTIC |
      SQLITE_DIRECTONLY |
      SQLITE_SUBTYPE |
      SQLITE_INNOCUOUS |
      SQLITE_FUNC_INTERNAL
  ;
  if( showInternFuncs ) mask = 0xffffffff;
  for(; p; p=p->pNext){
    const char *zType;
    static const char *azEnc[] = { 0, "utf8", "utf16le", "utf16be" };

    assert( SQLITE_FUNC_ENCMASK==0x3 );
    assert( strcmp(azEnc[SQLITE_UTF8],"utf8")==0 );
    assert( strcmp(azEnc[SQLITE_UTF16LE],"utf16le")==0 );
    assert( strcmp(azEnc[SQLITE_UTF16BE],"utf16be")==0 );

    if( p->xSFunc==0 ) continue;
    if( (p->funcFlags & SQLITE_FUNC_INTERNAL)!=0
     && showInternFuncs==0
    ){
      continue;
    }
    if( p->xValue!=0 ){
      zType = "w";
    }else if( p->xFinalize!=0 ){
      zType = "a";
    }else{
      zType = "s";
    }
    sqlite3VdbeMultiLoad(v, 1, "sissii",
       p->zName, isBuiltin,
       zType, azEnc[p->funcFlags&SQLITE_FUNC_ENCMASK],
       p->nArg,
       (p->funcFlags & mask) ^ SQLITE_INNOCUOUS
    );
  }
}